

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

string * __thiscall
dynamicgraph::command::Value::stringValue_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  ExceptionAbstract *this_00;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  Value *local_18;
  Value *this_local;
  
  local_18 = this;
  this_local = (Value *)__return_storage_ptr__;
  if (this->type_ == STRING) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->value_);
    return __return_storage_ptr__;
  }
  this_00 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
  local_1c = 700;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"value is not an string",&local_41);
  ExceptionAbstract::ExceptionAbstract(this_00,&local_1c,&local_40);
  __cxa_throw(this_00,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

std::string Value::stringValue() const {
  if (type_ == STRING) return *((const std::string *)value_);
  throw ExceptionAbstract(ExceptionAbstract::TOOLS, "value is not an string");
}